

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove4<(moira::Instr)71,(moira::Mode)9,(moira::Size)2>(Moira *this,u16 opcode)

{
  int *piVar1;
  bool bVar2;
  u32 uVar3;
  u32 uVar4;
  undefined8 in_RAX;
  uint n;
  AEStackFrame frame;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar3 = computeEA<(moira::Mode)9,(moira::Size)2,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,128ul>(this,uVar3,&local_21);
  if (local_21 == false) {
    n = opcode >> 9 & 7;
    bVar2 = (this->reg).sr.c;
    (this->reg).sr.n = (bool)((byte)(uVar3 >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar3 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    (*this->_vptr_Moira[0x19])(this,0xfffffffe);
    uVar4 = computeEA<(moira::Mode)4,(moira::Size)2,0ul>(this,n);
    if ((uVar4 & 1) == 0) {
      writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,uVar4,uVar3);
    }
    else {
      uVar3 = (this->reg).pc + 2;
      if (bVar2 == false) {
        frame = makeFrame<40ul>(this,uVar4,uVar3);
      }
      else {
        frame = makeFrame<1064ul>(this,uVar4,uVar3);
      }
      execAddressError(this,frame,2);
    }
    piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
    *piVar1 = *piVar1 + -2;
  }
  return;
}

Assistant:

void
Moira::execMove4(u16 opcode)
{
    u16 ird = getIRD();
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is pre-decrement, steps 4 and 5
     *  above are inverted. So it behaves like a read modify instruction and it
     *  is a class 0 instruction. Note: The behavior is the same disregarding
     *  transfer size (byte, word or long), and disregarding the source
     *  addressing mode."
     */
    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;

    // Determine next address error stack frame format
    const u64 flags0 = AE_WRITE | AE_DATA;
    const u64 flags1 = AE_WRITE | AE_DATA | AE_SET_CB3;
    const u64 flags2 = AE_WRITE | AE_DATA;
    int format = (S == Long) ? 0 : reg.sr.c ? 1 : 2;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch();
    sync(-2);

    ea = computeEA<MODE_PD, S>(dst);
    
    // Check for address error
    if (misaligned<S>(ea)) {
        if (format == 0) execAddressError(makeFrame<flags0>(ea + 2, reg.pc + 2, getSR(), ird));
        if (format == 1) execAddressError(makeFrame<flags1>(ea, reg.pc + 2), 2);
        if (format == 2) execAddressError(makeFrame<flags2>(ea, reg.pc + 2), 2);
        if (S != Long) updateAn <MODE_PD, S> (dst);
        return;
    }
    
    writeM<MODE_PD, S, REVERSE | POLLIPL>(ea, data);
    updateAn<MODE_PD, S>(dst);
}